

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

Length __thiscall tcmalloc::PageHeap::ReleaseAtLeastNPages(PageHeap *this,Length num_pages)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  Length LVar4;
  Length unaff_R12;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  Span *local_40;
  
  uVar6 = 0;
  do {
    if (num_pages <= uVar6) {
      return uVar6;
    }
    if ((this->stats_).free_bytes == 0) {
      return uVar6;
    }
    bVar2 = false;
    uVar5 = 0;
    do {
      if (0x80 < (uint)this->release_index_) {
        this->release_index_ = 0;
      }
      lVar3 = (long)this->release_index_;
      if (lVar3 == 0x80) {
        if ((this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          cVar7 = '\x06';
        }
        else {
          local_40 = *(Span **)((this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_left + 1);
LAB_00118fd8:
          LVar4 = ReleaseSpan(this,local_40);
          cVar7 = LVar4 == 0;
          if ((bool)cVar7) {
            unaff_R12 = uVar6;
          }
          uVar6 = LVar4 + uVar6;
        }
      }
      else {
        if (this->free_[lVar3].normal.next != &this->free_[lVar3].normal) {
          local_40 = this->free_[lVar3].normal.prev;
          goto LAB_00118fd8;
        }
        cVar7 = '\x06';
      }
      if ((cVar7 != '\x06') && (cVar7 != '\0')) break;
      this->release_index_ = this->release_index_ + 1;
      bVar1 = 0x7f < uVar5;
      bVar2 = num_pages <= uVar6 || bVar1;
      uVar5 = uVar5 + 1;
    } while (num_pages > uVar6 && !bVar1);
    if (!bVar2) {
      return unaff_R12;
    }
  } while( true );
}

Assistant:

Length PageHeap::ReleaseAtLeastNPages(Length num_pages) {
  ASSERT(lock_.IsHeld());
  Length released_pages = 0;

  // Round robin through the lists of free spans, releasing a
  // span from each list.  Stop after releasing at least num_pages
  // or when there is nothing more to release.
  while (released_pages < num_pages && stats_.free_bytes > 0) {
    for (int i = 0; i < kMaxPages+1 && released_pages < num_pages;
         i++, release_index_++) {
      Span *s;
      if (release_index_ > kMaxPages) release_index_ = 0;

      if (release_index_ == kMaxPages) {
        if (large_normal_.empty()) {
          continue;
        }
        s = (large_normal_.begin())->span;
      } else {
        SpanList* slist = &free_[release_index_];
        if (DLL_IsEmpty(&slist->normal)) {
          continue;
        }
        s = slist->normal.prev;
      }
      // TODO(todd) if the remaining number of pages to release
      // is significantly smaller than s->length, and s is on the
      // large freelist, should we carve s instead of releasing?
      // the whole thing?
      Length released_len = ReleaseSpan(s);
      // Some systems do not support release
      if (released_len == 0) return released_pages;
      released_pages += released_len;
    }
  }
  return released_pages;
}